

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O2

void __thiscall
COLLADASaxFWL::KinematicsInstanceKinematicsScene::addBindJointAxis
          (KinematicsInstanceKinematicsScene *this,KinematicsBindJointAxis *bindJointAxis)

{
  KinematicsBindJointAxis *local_8;
  
  local_8 = bindJointAxis;
  std::
  vector<COLLADASaxFWL::KinematicsBindJointAxis_*,_std::allocator<COLLADASaxFWL::KinematicsBindJointAxis_*>_>
  ::push_back(&this->mBindJointAxes,&local_8);
  return;
}

Assistant:

void addBindJointAxis(KinematicsBindJointAxis* bindJointAxis) { mBindJointAxes.push_back(bindJointAxis);}